

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ArrayType::ArrayType(ArrayType *this,string_view name)

{
  Location local_50;
  string_view local_30;
  ArrayType *local_20;
  ArrayType *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (ArrayType *)name._M_len;
  local_20 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30);
  Location::Location(&local_50);
  TypeEntry::TypeEntry(&this->super_TypeEntry,Array,local_30,&local_50);
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__ArrayType_0028a898;
  Field::Field(&this->field);
  return;
}

Assistant:

explicit ArrayType(std::string_view name = std::string_view())
      : TypeEntry(TypeEntryKind::Array) {}